

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string1.cpp
# Opt level: O1

void __thiscall String::String(String *this,String *other)

{
  size_t sVar1;
  char *__dest;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"String copy constuctor!",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  sVar1 = strlen(other->m_data);
  __dest = (char *)operator_new__(sVar1 + 1);
  this->m_data = __dest;
  strcpy(__dest,other->m_data);
  this->m_size = sVar1;
  return;
}

Assistant:

String::String(const String& other)
{
	cout << "String copy constuctor!" << endl;
	size_t len = strlen(other.m_data);
	m_data = new char[len + 1];
	strcpy(m_data, other.m_data);
	m_size = len;
}